

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

int pause(void)

{
  int iVar1;
  
  iVar1 = system("read -n 1 -p \"Press any key to continue...\"");
  return iVar1;
}

Assistant:

void pause()
{
    #ifdef _WIN32
        system("pause");
    #else
        system("read -n 1 -p \"Press any key to continue...\"");
    #endif
    /*
	cin.clear();
    cin.ignore(numeric_limits<streamsize>::max(), '\n');
    string dummy;
    cout << "Press enter key to continue . . .";
    getline(cin, dummy);
    */
}